

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_data.cpp
# Opt level: O2

void duckdb::ArrowUnionData::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  append_vector_t p_Var1;
  byte bVar2;
  uchar value;
  ArrowBuffer *this;
  Value *other;
  reference pvVar3;
  reference this_00;
  pointer pAVar4;
  type pAVar5;
  LogicalType *type;
  idx_t child_idx;
  element_type *peVar6;
  unsigned_long val;
  ulong uVar7;
  idx_t index;
  idx_t size;
  vector<duckdb::Vector,_true> child_vectors;
  Value local_138;
  Value resolved_value;
  UnifiedVectorFormat format;
  Value local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&format);
  Vector::ToUnifiedFormat(input,input_size,&format);
  size = to - from;
  this = ArrowAppendData::GetMainBuffer(append_data);
  child_vectors.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  child_vectors.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  child_vectors.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UnionType::CopyMemberTypes_abi_cxx11_
            ((child_list_t<LogicalType> *)&local_138,(UnionType *)&input->type,type);
  for (peVar6 = (element_type *)local_138.type_._0_8_;
      peVar6 != local_138.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar6 = peVar6 + 1) {
    ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
    emplace_back<duckdb::LogicalType_const&,unsigned_long&>
              ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&child_vectors,
               (LogicalType *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)&peVar6->alias)->_M_local_buf + 0x10),&size);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_138);
  for (index = from; index < to; index = index + 1) {
    Vector::GetValue(&local_138,input,index);
    Value::Value(&resolved_value,(nullptr_t)0x0);
    if (local_138.is_null == false) {
      bVar2 = UnionValue::GetTag(&local_138);
      other = UnionValue::GetValue(&local_138);
      Value::operator=(&resolved_value,other);
      val = (unsigned_long)bVar2;
    }
    else {
      val = 0;
    }
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)child_vectors.
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)child_vectors.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar7 = uVar7 + 1)
    {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&child_vectors,uVar7);
      if (val == uVar7) {
        Value::Value(&local_70,&resolved_value);
      }
      else {
        Value::Value(&local_70,(nullptr_t)0x0);
      }
      Vector::SetValue(pvVar3,index,&local_70);
      Value::~Value(&local_70);
    }
    value = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val);
    ArrowBuffer::push_back<unsigned_char>(this,value);
    Value::~Value(&resolved_value);
    Value::~Value(&local_138);
  }
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)child_vectors.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)child_vectors.
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar7 = uVar7 + 1) {
    this_00 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
              ::get<true>(&append_data->child_data,uVar7);
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&child_vectors,uVar7);
    pAVar4 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
             ::operator->(this_00);
    p_Var1 = pAVar4->append_vector;
    pAVar5 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
             ::operator*(this_00);
    (*p_Var1)(pAVar5,pvVar3,from,to,size);
  }
  append_data->row_count = append_data->row_count + size;
  ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::~vector
            (&child_vectors.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>);
  UnifiedVectorFormat::~UnifiedVectorFormat(&format);
  return;
}

Assistant:

void ArrowUnionData::Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
	UnifiedVectorFormat format;
	input.ToUnifiedFormat(input_size, format);
	idx_t size = to - from;

	auto &types_buffer = append_data.GetMainBuffer();

	duckdb::vector<Vector> child_vectors;
	for (const auto &child : UnionType::CopyMemberTypes(input.GetType())) {
		child_vectors.emplace_back(child.second, size);
	}

	for (idx_t input_idx = from; input_idx < to; input_idx++) {
		const auto &val = input.GetValue(input_idx);

		idx_t tag = 0;
		Value resolved_value(nullptr);
		if (!val.IsNull()) {
			tag = UnionValue::GetTag(val);

			resolved_value = UnionValue::GetValue(val);
		}

		for (idx_t child_idx = 0; child_idx < child_vectors.size(); child_idx++) {
			child_vectors[child_idx].SetValue(input_idx, child_idx == tag ? resolved_value : Value(nullptr));
		}
		types_buffer.push_back<data_t>(NumericCast<data_t>(tag));
	}

	for (idx_t child_idx = 0; child_idx < child_vectors.size(); child_idx++) {
		auto &child_buffer = append_data.child_data[child_idx];
		auto &child = child_vectors[child_idx];
		child_buffer->append_vector(*child_buffer, child, from, to, size);
	}
	append_data.row_count += size;
}